

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O1

fy_token * fy_document_tag_directive_lookup(fy_document *fyd,char *handle)

{
  int iVar1;
  size_t in_RAX;
  size_t __n;
  fy_token_list *pfVar2;
  char *__s1;
  fy_token *pfVar3;
  fy_token *fyt;
  size_t h_size;
  size_t local_38;
  
  if (handle == (char *)0x0 || fyd == (fy_document *)0x0) {
LAB_00120113:
    fyt = (fy_token *)0x0;
  }
  else {
    local_38 = in_RAX;
    __n = strlen(handle);
    pfVar3 = (fy_token *)0x0;
    do {
      if (fyd->fyds == (fy_document_state *)0x0) {
        fyt = (fy_token *)0x0;
      }
      else {
        pfVar2 = &fyd->fyds->fyt_td;
        if (pfVar3 == (fy_token *)0x0) {
          pfVar3 = (fy_token *)pfVar2;
        }
        pfVar3 = (fy_token *)(pfVar3->node).next;
        fyt = pfVar3;
        if (pfVar3 == (fy_token *)pfVar2) {
          pfVar3 = (fy_token *)0x0;
          fyt = pfVar3;
        }
      }
      if (fyt == (fy_token *)0x0) goto LAB_00120113;
      __s1 = fy_tag_directive_token_handle(fyt,&local_38);
    } while (((__s1 == (char *)0x0) || (local_38 != __n)) ||
            (iVar1 = bcmp(__s1,handle,__n), iVar1 != 0));
  }
  return fyt;
}

Assistant:

struct fy_token *fy_document_tag_directive_lookup(struct fy_document *fyd, const char *handle) {
    struct fy_token *fyt;
    void *iter;
    const char *h;
    size_t h_size, len;

    if (!fyd || !handle)
        return NULL;
    len = strlen(handle);

    iter = NULL;
    while ((fyt = fy_document_tag_directive_iterate(fyd, &iter)) != NULL) {
        h = fy_tag_directive_token_handle(fyt, &h_size);
        if (!h)
            continue;
        if (h_size == len && !memcmp(h, handle, len))
            return fyt;
    }
    return NULL;
}